

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

void __thiscall Polymer::CheckBehind(Polymer *this,int old_start,int new_start)

{
  long lVar1;
  pointer pIVar2;
  bool bVar3;
  int iVar4;
  Interval<std::shared_ptr<ReleaseSite>,_unsigned_long> *interval;
  SpeciesTracker *this_00;
  _Alloc_hider _Var5;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  *__range1;
  pointer pIVar6;
  BindingSite *this_01;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  term_results;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  string local_78;
  unsigned_long local_58;
  unsigned_long local_50;
  intervalVector local_48;
  
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = (unsigned_long)old_start;
  local_58 = (unsigned_long)(new_start + 1);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,local_50,local_58,&local_48);
  pIVar2 = local_48.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar6 = local_48.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar2; pIVar6 = pIVar6 + 1) {
    this_01 = (pIVar6->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((this_01->super_FixedElement).stop_ < new_start) {
      iVar4 = (this_01->super_FixedElement).covered_;
      if (0 < iVar4) {
        iVar4 = iVar4 + -1;
        (this_01->super_FixedElement).covered_ = iVar4;
      }
      if (iVar4 == 0 && 0 < (this_01->super_FixedElement).old_covered_) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"__ribosome","");
        BindingSite::CheckInteraction(this_01,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        LogUncover(this,&(((pIVar6->value).
                           super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         super_FixedElement).name_);
        this_01 = (pIVar6->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if ((this_01->super_FixedElement).first_exposure_ == false) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"__ribosome","");
          bVar3 = BindingSite::CheckInteraction(this_01,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if (bVar3) {
            this_00 = SpeciesTracker::Instance();
            SpeciesTracker::IncrementTranscript
                      (this_00,&(((pIVar6->value).
                                  super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 )->super_FixedElement).gene_,1);
            this_01 = (pIVar6->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            (this_01->super_FixedElement).first_exposure_ = true;
            this->total_elements_ = this->total_elements_ + 1;
          }
          else {
            this_01 = (pIVar6->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
          }
        }
      }
      (this_01->super_FixedElement).old_covered_ = (this_01->super_FixedElement).covered_;
    }
  }
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
            (&this->release_sites_,local_50,local_58,(intervalVector *)&local_78);
  for (_Var5._M_p = local_78._M_dataplus._M_p; _Var5._M_p != (pointer)local_78._M_string_length;
      _Var5._M_p = _Var5._M_p + 0x20) {
    lVar1 = *(long *)(_Var5._M_p + 0x10);
    if (*(int *)(lVar1 + 0x3c) < new_start) {
      iVar4 = *(int *)(lVar1 + 0x90);
      if (0 < iVar4) {
        iVar4 = iVar4 + -1;
        *(int *)(lVar1 + 0x90) = iVar4;
      }
      if (iVar4 == 0 && 0 < *(int *)(lVar1 + 0x94)) {
        *(undefined1 *)(lVar1 + 0x9d) = 0;
      }
      *(int *)(lVar1 + 0x94) = iVar4;
    }
  }
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::~vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
             *)&local_78);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Polymer::CheckBehind(int old_start, int new_start) {
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(old_start, new_start + 1, results);
  for (auto &interval : results) {
    // std::cout << interval.value->name() + " " +
    //                  std::to_string(interval.value->start()) +
    //                  std::to_string(interval.value->stop()) + " " +
    //                  std::to_string(new_start)
    //           << std::endl;
    if (interval.value->stop() < new_start) {
      // std::cout << interval.value->name() << std::endl;
      interval.value->Uncover();
      if (interval.value->WasUncovered()) {
        if (interval.value->CheckInteraction("__ribosome")) {
          // std::cout << "RBS uncovered!" << std::endl;
        }
        // Record changes that species was covered
        LogUncover(interval.value->name());
        // Is this a new transcript?
        if (!interval.value->first_exposure() &&
            interval.value->CheckInteraction("__ribosome")) {
          SpeciesTracker::Instance().IncrementTranscript(interval.value->gene(),
                                                         1);
          interval.value->first_exposure(true);
          total_elements_ += 1;
        }
      }
      interval.value->ResetState();
    }
  }

  std::vector<Interval<ReleaseSite::Ptr>> term_results;
  release_sites_.findOverlapping(old_start, new_start + 1, term_results);
  for (auto &interval : term_results) {
    if (interval.value->stop() < new_start) {
      interval.value->Uncover();
      // if (interval.value->name() != "stop_codon") {
      //   std::cout << "Terminator uncovered!" + interval.value->name()
      //             << std::endl;
      //   std::cout << interval.value->IsCovered() << std::endl;
      // }
      if (interval.value->WasUncovered()) {
        // Record changes that species was covered
        // LogUncover(interval.value->name());
        // Is this a terminator being uncovered?
        // if (interval.value->name() != "stop_codon") {
        //   std::cout << "Readthrough set to false!" << std::endl;
        // }
        interval.value->readthrough(false);
      }
      interval.value->ResetState();
    }
  }
}